

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_1_header * nifti_convert_nim2nhdr(nifti_1_header *__return_storage_ptr__,nifti_image *nim)

{
  float local_24;
  nifti_1_header *nhdr;
  nifti_image *nim_local;
  
  memset(__return_storage_ptr__,0,0x15c);
  __return_storage_ptr__->sizeof_hdr = 0x15c;
  __return_storage_ptr__->regular = 'r';
  __return_storage_ptr__->dim[0] = (short)nim->ndim;
  __return_storage_ptr__->dim[1] = (short)nim->nx;
  __return_storage_ptr__->dim[2] = (short)nim->ny;
  __return_storage_ptr__->dim[3] = (short)nim->nz;
  __return_storage_ptr__->dim[4] = (short)nim->nt;
  __return_storage_ptr__->dim[5] = (short)nim->nu;
  __return_storage_ptr__->dim[6] = (short)nim->nv;
  __return_storage_ptr__->dim[7] = (short)nim->nw;
  __return_storage_ptr__->pixdim[0] = 0.0;
  __return_storage_ptr__->pixdim[1] = nim->dx;
  __return_storage_ptr__->pixdim[2] = nim->dy;
  __return_storage_ptr__->pixdim[3] = nim->dz;
  __return_storage_ptr__->pixdim[4] = nim->dt;
  __return_storage_ptr__->pixdim[5] = nim->du;
  __return_storage_ptr__->pixdim[6] = nim->dv;
  __return_storage_ptr__->pixdim[7] = nim->dw;
  __return_storage_ptr__->datatype = (short)nim->datatype;
  __return_storage_ptr__->bitpix = (short)(nim->nbyper << 3);
  if (nim->cal_min <= nim->cal_max && nim->cal_max != nim->cal_min) {
    __return_storage_ptr__->cal_max = nim->cal_max;
    __return_storage_ptr__->cal_min = nim->cal_min;
  }
  if ((nim->scl_slope != 0.0) || (NAN(nim->scl_slope))) {
    __return_storage_ptr__->scl_slope = nim->scl_slope;
    __return_storage_ptr__->scl_inter = nim->scl_inter;
  }
  if (nim->descrip[0] != '\0') {
    memcpy(__return_storage_ptr__->descrip,nim->descrip,0x4f);
    __return_storage_ptr__->descrip[0x4f] = '\0';
  }
  if (nim->aux_file[0] != '\0') {
    *(undefined8 *)__return_storage_ptr__->aux_file = *(undefined8 *)nim->aux_file;
    *(undefined8 *)(__return_storage_ptr__->aux_file + 8) = *(undefined8 *)(nim->aux_file + 8);
    *(undefined4 *)(__return_storage_ptr__->aux_file + 0x10) = *(undefined4 *)(nim->aux_file + 0x10)
    ;
    *(undefined2 *)(__return_storage_ptr__->aux_file + 0x14) = *(undefined2 *)(nim->aux_file + 0x14)
    ;
    __return_storage_ptr__->aux_file[0x16] = nim->aux_file[0x16];
    __return_storage_ptr__->aux_file[0x17] = '\0';
  }
  if (0 < nim->nifti_type) {
    if (nim->nifti_type == 1) {
      strcpy(__return_storage_ptr__->magic,"n+1");
    }
    else {
      strcpy(__return_storage_ptr__->magic,"ni1");
    }
    __return_storage_ptr__->pixdim[1] = ABS(__return_storage_ptr__->pixdim[1]);
    __return_storage_ptr__->pixdim[2] = ABS(__return_storage_ptr__->pixdim[2]);
    __return_storage_ptr__->pixdim[3] = ABS(__return_storage_ptr__->pixdim[3]);
    __return_storage_ptr__->pixdim[4] = ABS(__return_storage_ptr__->pixdim[4]);
    __return_storage_ptr__->pixdim[5] = ABS(__return_storage_ptr__->pixdim[5]);
    __return_storage_ptr__->pixdim[6] = ABS(__return_storage_ptr__->pixdim[6]);
    __return_storage_ptr__->pixdim[7] = ABS(__return_storage_ptr__->pixdim[7]);
    __return_storage_ptr__->intent_code = (short)nim->intent_code;
    __return_storage_ptr__->intent_p1 = nim->intent_p1;
    __return_storage_ptr__->intent_p2 = nim->intent_p2;
    __return_storage_ptr__->intent_p3 = nim->intent_p3;
    if (nim->intent_name[0] != '\0') {
      *(undefined8 *)__return_storage_ptr__->intent_name = *(undefined8 *)nim->intent_name;
      *(undefined4 *)(__return_storage_ptr__->intent_name + 8) =
           *(undefined4 *)(nim->intent_name + 8);
      *(undefined2 *)(__return_storage_ptr__->intent_name + 0xc) =
           *(undefined2 *)(nim->intent_name + 0xc);
      __return_storage_ptr__->intent_name[0xe] = nim->intent_name[0xe];
      __return_storage_ptr__->intent_name[0xf] = '\0';
    }
    __return_storage_ptr__->vox_offset = (float)nim->iname_offset;
    __return_storage_ptr__->xyzt_units = (byte)nim->xyz_units & 7 | (byte)nim->time_units & 0x38;
    __return_storage_ptr__->toffset = nim->toffset;
    if (0 < nim->qform_code) {
      __return_storage_ptr__->qform_code = (short)nim->qform_code;
      __return_storage_ptr__->quatern_b = nim->quatern_b;
      __return_storage_ptr__->quatern_c = nim->quatern_c;
      __return_storage_ptr__->quatern_d = nim->quatern_d;
      __return_storage_ptr__->qoffset_x = nim->qoffset_x;
      __return_storage_ptr__->qoffset_y = nim->qoffset_y;
      __return_storage_ptr__->qoffset_z = nim->qoffset_z;
      local_24 = 1.0;
      if (nim->qfac < 0.0) {
        local_24 = -1.0;
      }
      __return_storage_ptr__->pixdim[0] = local_24;
    }
    if (0 < nim->sform_code) {
      __return_storage_ptr__->sform_code = (short)nim->sform_code;
      __return_storage_ptr__->srow_x[0] = (nim->sto_xyz).m[0][0];
      __return_storage_ptr__->srow_x[1] = (nim->sto_xyz).m[0][1];
      __return_storage_ptr__->srow_x[2] = (nim->sto_xyz).m[0][2];
      __return_storage_ptr__->srow_x[3] = (nim->sto_xyz).m[0][3];
      __return_storage_ptr__->srow_y[0] = (nim->sto_xyz).m[1][0];
      __return_storage_ptr__->srow_y[1] = (nim->sto_xyz).m[1][1];
      __return_storage_ptr__->srow_y[2] = (nim->sto_xyz).m[1][2];
      __return_storage_ptr__->srow_y[3] = (nim->sto_xyz).m[1][3];
      __return_storage_ptr__->srow_z[0] = (nim->sto_xyz).m[2][0];
      __return_storage_ptr__->srow_z[1] = (nim->sto_xyz).m[2][1];
      __return_storage_ptr__->srow_z[2] = (nim->sto_xyz).m[2][2];
      __return_storage_ptr__->srow_z[3] = (nim->sto_xyz).m[2][3];
    }
    __return_storage_ptr__->dim_info =
         (byte)nim->freq_dim & 3 | ((byte)nim->phase_dim & 3) << 2 | ((byte)nim->slice_dim & 3) << 4
    ;
    __return_storage_ptr__->slice_code = (char)nim->slice_code;
    __return_storage_ptr__->slice_start = (short)nim->slice_start;
    __return_storage_ptr__->slice_end = (short)nim->slice_end;
    __return_storage_ptr__->slice_duration = nim->slice_duration;
  }
  return __return_storage_ptr__;
}

Assistant:

struct nifti_1_header nifti_convert_nim2nhdr(const nifti_image * nim)
{
   struct nifti_1_header nhdr;

   memset(&nhdr,0,sizeof(nhdr)) ;  /* zero out header, to be safe */


   /**- load the ANALYZE-7.5 generic parts of the header struct */

   nhdr.sizeof_hdr = sizeof(nhdr) ;
   nhdr.regular    = 'r' ;             /* for some stupid reason */

   nhdr.dim[0] = nim->ndim ;
   nhdr.dim[1] = nim->nx ; nhdr.dim[2] = nim->ny ; nhdr.dim[3] = nim->nz ;
   nhdr.dim[4] = nim->nt ; nhdr.dim[5] = nim->nu ; nhdr.dim[6] = nim->nv ;
   nhdr.dim[7] = nim->nw ;

   nhdr.pixdim[0] = 0.0f ;
   nhdr.pixdim[1] = nim->dx ; nhdr.pixdim[2] = nim->dy ;
   nhdr.pixdim[3] = nim->dz ; nhdr.pixdim[4] = nim->dt ;
   nhdr.pixdim[5] = nim->du ; nhdr.pixdim[6] = nim->dv ;
   nhdr.pixdim[7] = nim->dw ;

   nhdr.datatype = nim->datatype ;
   nhdr.bitpix   = 8 * nim->nbyper ;

   if( nim->cal_max > nim->cal_min ){
     nhdr.cal_max = nim->cal_max ;
     nhdr.cal_min = nim->cal_min ;
   }

   if( nim->scl_slope != 0.0 ){
     nhdr.scl_slope = nim->scl_slope ;
     nhdr.scl_inter = nim->scl_inter ;
   }

   if( nim->descrip[0] != '\0' ){
     memcpy(nhdr.descrip ,nim->descrip ,79) ; nhdr.descrip[79] = '\0' ;
   }
   if( nim->aux_file[0] != '\0' ){
     memcpy(nhdr.aux_file ,nim->aux_file ,23) ; nhdr.aux_file[23] = '\0' ;
   }

   /**- Load NIFTI specific stuff into the header */

   if( nim->nifti_type > NIFTI_FTYPE_ANALYZE ){ /* then not ANALYZE */

     if( nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ) strcpy(nhdr.magic,"n+1") ;
     else                                          strcpy(nhdr.magic,"ni1") ;

     nhdr.pixdim[1] = (float)fabs(nhdr.pixdim[1]) ; nhdr.pixdim[2] = (float)fabs(nhdr.pixdim[2]) ;
     nhdr.pixdim[3] = (float)fabs(nhdr.pixdim[3]) ; nhdr.pixdim[4] = (float)fabs(nhdr.pixdim[4]) ;
     nhdr.pixdim[5] = (float)fabs(nhdr.pixdim[5]) ; nhdr.pixdim[6] = (float)fabs(nhdr.pixdim[6]) ;
     nhdr.pixdim[7] = (float)fabs(nhdr.pixdim[7]) ;

     nhdr.intent_code = nim->intent_code ;
     nhdr.intent_p1   = nim->intent_p1 ;
     nhdr.intent_p2   = nim->intent_p2 ;
     nhdr.intent_p3   = nim->intent_p3 ;
     if( nim->intent_name[0] != '\0' ){
       memcpy(nhdr.intent_name,nim->intent_name,15) ;
       nhdr.intent_name[15] = '\0' ;
     }

     nhdr.vox_offset  = (float) nim->iname_offset ;
     nhdr.xyzt_units  = SPACE_TIME_TO_XYZT( nim->xyz_units, nim->time_units ) ;
     nhdr.toffset     = nim->toffset ;

     if( nim->qform_code > 0 ){
       nhdr.qform_code = nim->qform_code ;
       nhdr.quatern_b  = nim->quatern_b ;
       nhdr.quatern_c  = nim->quatern_c ;
       nhdr.quatern_d  = nim->quatern_d ;
       nhdr.qoffset_x  = nim->qoffset_x ;
       nhdr.qoffset_y  = nim->qoffset_y ;
       nhdr.qoffset_z  = nim->qoffset_z ;
       nhdr.pixdim[0]  = (nim->qfac >= 0.0) ? 1.0f : -1.0f ;
     }

     if( nim->sform_code > 0 ){
       nhdr.sform_code = nim->sform_code ;
       nhdr.srow_x[0]  = nim->sto_xyz.m[0][0] ;
       nhdr.srow_x[1]  = nim->sto_xyz.m[0][1] ;
       nhdr.srow_x[2]  = nim->sto_xyz.m[0][2] ;
       nhdr.srow_x[3]  = nim->sto_xyz.m[0][3] ;
       nhdr.srow_y[0]  = nim->sto_xyz.m[1][0] ;
       nhdr.srow_y[1]  = nim->sto_xyz.m[1][1] ;
       nhdr.srow_y[2]  = nim->sto_xyz.m[1][2] ;
       nhdr.srow_y[3]  = nim->sto_xyz.m[1][3] ;
       nhdr.srow_z[0]  = nim->sto_xyz.m[2][0] ;
       nhdr.srow_z[1]  = nim->sto_xyz.m[2][1] ;
       nhdr.srow_z[2]  = nim->sto_xyz.m[2][2] ;
       nhdr.srow_z[3]  = nim->sto_xyz.m[2][3] ;
     }

     nhdr.dim_info = FPS_INTO_DIM_INFO( nim->freq_dim ,
                                        nim->phase_dim , nim->slice_dim ) ;
     nhdr.slice_code     = nim->slice_code ;
     nhdr.slice_start    = nim->slice_start ;
     nhdr.slice_end      = nim->slice_end ;
     nhdr.slice_duration = nim->slice_duration ;
   }

   return nhdr;
}